

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O0

lzham_compress_status_t
lzham::lzham_lib_compress_memory
          (lzham_compress_params *pParams,lzham_uint8 *pDst_buf,size_t *pDst_len,
          lzham_uint8 *pSrc_buf,size_t src_len,lzham_uint32 *pAdler32)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint32 uVar4;
  lzham *this;
  lzcompressor *this_00;
  byte_vec *this_01;
  uchar *__src;
  long in_RCX;
  ulong *in_RDX;
  lzcompressor *in_RSI;
  EVP_PKEY_CTX *ctx;
  long in_RDI;
  ulong in_R8;
  uint32 *in_R9;
  size_t dst_buf_size;
  byte_vec *comp_data;
  lzcompressor *pCompressor;
  task_pool *pTP;
  lzham_malloc_context malloc_context;
  lzham_compress_status_t status;
  init_params internal_params;
  lzcompressor *in_stack_ffffffffffffff48;
  lzham_compress_params *in_stack_ffffffffffffff50;
  init_params *in_stack_ffffffffffffff58;
  ulong uVar5;
  lzcompressor *local_90;
  undefined4 in_stack_ffffffffffffff80;
  lzcompressor *in_stack_ffffffffffffff88;
  uint local_70;
  lzham_compress_status_t local_4;
  
  if ((in_RDI == 0) || (in_RDX == (ulong *)0x0)) {
    local_4 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  else if ((in_R8 == 0) || (in_RCX != 0)) {
    if (in_R8 < 0x100000000) {
      lzcompressor::init_params::init_params((init_params *)&stack0xffffffffffffff88);
      uVar2 = (uint)in_RDI;
      local_4 = create_internal_init_params(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      if (local_4 == LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
        this = (lzham *)lzham::lzham_create_malloc_context((lzham *)0x0,uVar2);
        local_90 = (lzcompressor *)0x0;
        if (local_70 != 0) {
          local_90 = (lzcompressor *)
                     lzham_new<lzham::task_pool,void*>
                               (in_stack_ffffffffffffff58,(void **)in_stack_ffffffffffffff50);
          ctx = (EVP_PKEY_CTX *)(ulong)local_70;
          uVar2 = task_pool::init((task_pool *)local_90,ctx);
          in_stack_ffffffffffffff88 = local_90;
          if ((uVar2 & 1) == 0) {
            lzham::lzham_destroy_malloc_context(this,ctx);
            return LZHAM_COMP_STATUS_FAILED_INITIALIZING;
          }
        }
        this_00 = lzham_new<lzham::lzcompressor,void*>
                            (in_stack_ffffffffffffff58,(void **)in_stack_ffffffffffffff50);
        if (this_00 == (lzcompressor *)0x0) {
          lzham_delete<lzham::task_pool>
                    (in_stack_ffffffffffffff50,(task_pool *)in_stack_ffffffffffffff48);
          lzham::lzham_destroy_malloc_context(this,local_90);
          local_4 = LZHAM_COMP_STATUS_FAILED_INITIALIZING;
        }
        else {
          uVar2 = lzcompressor::init(this_00,(EVP_PKEY_CTX *)&stack0xffffffffffffff88);
          if ((uVar2 & 1) == 0) {
            lzham_delete<lzham::task_pool>
                      (in_stack_ffffffffffffff50,(task_pool *)in_stack_ffffffffffffff48);
            lzham_delete<lzham::lzcompressor>(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
            lzham::lzham_destroy_malloc_context(this,this_00);
            local_4 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
          }
          else if ((in_R8 == 0) ||
                  (bVar1 = lzcompressor::put_bytes
                                     (in_stack_ffffffffffffff88,
                                      (void *)CONCAT44(local_4,in_stack_ffffffffffffff80),
                                      (uint)((ulong)this >> 0x20)), bVar1)) {
            bVar1 = lzcompressor::put_bytes
                              (in_stack_ffffffffffffff88,
                               (void *)CONCAT44(local_4,in_stack_ffffffffffffff80),
                               (uint)((ulong)this >> 0x20));
            if (bVar1) {
              this_01 = lzcompressor::get_compressed_data(this_00);
              uVar5 = *in_RDX;
              uVar3 = vector<unsigned_char>::size(this_01);
              *in_RDX = (ulong)uVar3;
              if (in_R9 != (uint32 *)0x0) {
                uVar4 = lzcompressor::get_src_adler32(this_00);
                *in_R9 = uVar4;
              }
              uVar3 = vector<unsigned_char>::size(this_01);
              if (uVar5 < uVar3) {
                lzham_delete<lzham::task_pool>
                          (in_stack_ffffffffffffff50,(task_pool *)in_stack_ffffffffffffff48);
                lzham_delete<lzham::lzcompressor>
                          (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
                lzham::lzham_destroy_malloc_context(this,this_00);
                local_4 = LZHAM_COMP_STATUS_OUTPUT_BUF_TOO_SMALL;
              }
              else {
                __src = vector<unsigned_char>::get_ptr(this_01);
                uVar3 = vector<unsigned_char>::size(this_01);
                memcpy(in_RSI,__src,(ulong)uVar3);
                lzham_delete<lzham::task_pool>(__src,(task_pool *)in_RSI);
                lzham_delete<lzham::lzcompressor>(__src,in_RSI);
                lzham::lzham_destroy_malloc_context(this,this_00);
                local_4 = LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE;
              }
            }
            else {
              *in_RDX = 0;
              lzham_delete<lzham::task_pool>
                        (in_stack_ffffffffffffff50,(task_pool *)in_stack_ffffffffffffff48);
              lzham_delete<lzham::lzcompressor>(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48)
              ;
              lzham::lzham_destroy_malloc_context(this,this_00);
              local_4 = LZHAM_COMP_STATUS_FAILED;
            }
          }
          else {
            *in_RDX = 0;
            lzham_delete<lzham::task_pool>
                      (in_stack_ffffffffffffff50,(task_pool *)in_stack_ffffffffffffff48);
            lzham_delete<lzham::lzcompressor>(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
            lzham::lzham_destroy_malloc_context(this,this_00);
            local_4 = LZHAM_COMP_STATUS_FAILED;
          }
        }
      }
    }
    else {
      local_4 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
    }
  }
  else {
    local_4 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  return local_4;
}

Assistant:

lzham_compress_status_t LZHAM_CDECL lzham_lib_compress_memory(const lzham_compress_params *pParams, lzham_uint8* pDst_buf, size_t *pDst_len, const lzham_uint8* pSrc_buf, size_t src_len, lzham_uint32 *pAdler32)
   {
      if ((!pParams) || (!pDst_len))
      {
         LZHAM_LOG_ERROR(6019);
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }

      if (src_len)
      {
         if (!pSrc_buf)
         {
            LZHAM_LOG_ERROR(6020);
            return LZHAM_COMP_STATUS_INVALID_PARAMETER;
         }
      }

      if (sizeof(size_t) > sizeof(uint32))
      {
         if (src_len > cUINT32_MAX)
         {
            LZHAM_LOG_ERROR(6021);
            return LZHAM_COMP_STATUS_INVALID_PARAMETER;
         }
      }

      lzcompressor::init_params internal_params;
      lzham_compress_status_t status = create_internal_init_params(internal_params, pParams);
      if (status != LZHAM_COMP_STATUS_SUCCESS)
      {
         LZHAM_LOG_ERROR(6022);
         return status;
      }

      lzham_malloc_context malloc_context = lzham_create_malloc_context(0);

      task_pool *pTP = NULL;
      if (internal_params.m_max_helper_threads)
      {
         pTP = lzham_new<task_pool>(malloc_context, malloc_context);
         if (!pTP->init(internal_params.m_max_helper_threads))
         {
            lzham_destroy_malloc_context(malloc_context);
            LZHAM_LOG_ERROR(6023);
            return LZHAM_COMP_STATUS_FAILED_INITIALIZING;
         }

         internal_params.m_pTask_pool = pTP;
      }

      lzcompressor *pCompressor = lzham_new<lzcompressor>(malloc_context, malloc_context);
      if (!pCompressor)
      {
         lzham_delete(malloc_context, pTP);
         lzham_destroy_malloc_context(malloc_context);
         LZHAM_LOG_ERROR(6024);
         return LZHAM_COMP_STATUS_FAILED_INITIALIZING;
      }

      if (!pCompressor->init(internal_params))
      {
         lzham_delete(malloc_context, pTP);
         lzham_delete(malloc_context, pCompressor);
         lzham_destroy_malloc_context(malloc_context);
         LZHAM_LOG_ERROR(6025);
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }

      if (src_len)
      {
         if (!pCompressor->put_bytes(pSrc_buf, static_cast<uint32>(src_len)))
         {
            *pDst_len = 0;
            lzham_delete(malloc_context, pTP);
            lzham_delete(malloc_context, pCompressor);
            lzham_destroy_malloc_context(malloc_context);
            LZHAM_LOG_ERROR(6026);
            return LZHAM_COMP_STATUS_FAILED;
         }
      }

      if (!pCompressor->put_bytes(NULL, 0))
      {
         *pDst_len = 0;
         lzham_delete(malloc_context, pTP);
         lzham_delete(malloc_context, pCompressor);
         lzham_destroy_malloc_context(malloc_context);
         LZHAM_LOG_ERROR(6027);
         return LZHAM_COMP_STATUS_FAILED;
      }

      const byte_vec &comp_data = pCompressor->get_compressed_data();

      size_t dst_buf_size = *pDst_len;
      *pDst_len = comp_data.size();

      if (pAdler32)
         *pAdler32 = pCompressor->get_src_adler32();

      if (comp_data.size() > dst_buf_size)
      {
         lzham_delete(malloc_context, pTP);
         lzham_delete(malloc_context, pCompressor);
         lzham_destroy_malloc_context(malloc_context);
         LZHAM_LOG_ERROR(6028);
         return LZHAM_COMP_STATUS_OUTPUT_BUF_TOO_SMALL;
      }

      memcpy(pDst_buf, comp_data.get_ptr(), comp_data.size());

      lzham_delete(malloc_context, pTP);
      lzham_delete(malloc_context, pCompressor);
      lzham_destroy_malloc_context(malloc_context);
      return LZHAM_COMP_STATUS_SUCCESS;
   }